

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *node,Reader *replacement)

{
  short sVar1;
  void *pvVar2;
  undefined4 uVar3;
  Which WVar4;
  Which WVar5;
  uint uVar6;
  uint64_t scopeId;
  int iVar7;
  uint64_t replacementScopeId;
  bool bVar8;
  DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which> _kjCondition;
  Fault f;
  PointerReader local_58;
  
  if ((node->_reader).dataSize < 0x70) {
    WVar4 = FILE;
  }
  else {
    WVar4 = *(Which *)((long)(node->_reader).data + 0xc);
  }
  if ((replacement->_reader).dataSize < 0x70) {
    WVar5 = FILE;
  }
  else {
    WVar5 = *(Which *)((long)(replacement->_reader).data + 0xc);
  }
  _kjCondition.right = WVar5;
  _kjCondition.left = WVar4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = WVar4 == WVar5;
  if (WVar4 == WVar5) {
    iVar7 = 0x7fffffff;
    uVar6 = (replacement->_reader).nestingLimit;
    if ((replacement->_reader).pointerCount < 6) {
      uVar6 = 0x7fffffff;
      f.exception._0_4_ = 0;
      f.exception._4_4_ = 0;
    }
    else {
      f.exception._0_4_ = *(undefined4 *)&(replacement->_reader).segment;
      f.exception._4_4_ = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
    }
    capnp::_::PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&f,INLINE_COMPOSITE,(word *)0x0);
    bVar8 = 5 < (node->_reader).pointerCount;
    local_58.pointer = (WirePointer *)0x0;
    if (bVar8) {
      iVar7 = (node->_reader).nestingLimit;
      local_58.pointer = (node->_reader).pointers + 5;
    }
    uVar3 = _kjCondition._24_4_;
    local_58.segment._0_4_ = 0;
    local_58.segment._4_4_ = 0;
    local_58.capTable._0_4_ = 0;
    local_58.capTable._4_4_ = 0;
    if (bVar8) {
      local_58.segment._0_4_ = *(undefined4 *)&(node->_reader).segment;
      local_58.segment._4_4_ = *(undefined4 *)((long)&(node->_reader).segment + 4);
      local_58.capTable._0_4_ = *(undefined4 *)&(node->_reader).capTable;
      local_58.capTable._4_4_ = *(undefined4 *)((long)&(node->_reader).capTable + 4);
    }
    local_58.nestingLimit = iVar7;
    capnp::_::PointerReader::getList((ListReader *)&f,&local_58,INLINE_COMPOSITE,(word *)0x0);
    if (uVar6 < (uint)uVar3) {
      replacementIsNewer(this);
    }
    else {
      iVar7 = 0x7fffffff;
      uVar6 = (replacement->_reader).nestingLimit;
      if ((replacement->_reader).pointerCount < 6) {
        uVar6 = 0x7fffffff;
        f.exception._0_4_ = 0;
        f.exception._4_4_ = 0;
      }
      else {
        f.exception._0_4_ = *(undefined4 *)&(replacement->_reader).segment;
        f.exception._4_4_ = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
      }
      capnp::_::PointerReader::getList
                ((ListReader *)&_kjCondition,(PointerReader *)&f,INLINE_COMPOSITE,(word *)0x0);
      bVar8 = 5 < (node->_reader).pointerCount;
      local_58.pointer = (WirePointer *)0x0;
      if (bVar8) {
        iVar7 = (node->_reader).nestingLimit;
        local_58.pointer = (node->_reader).pointers + 5;
      }
      uVar3 = _kjCondition._24_4_;
      local_58.segment._0_4_ = 0;
      local_58.segment._4_4_ = 0;
      local_58.capTable._0_4_ = 0;
      local_58.capTable._4_4_ = 0;
      if (bVar8) {
        local_58.segment._0_4_ = *(undefined4 *)&(node->_reader).segment;
        local_58.segment._4_4_ = *(undefined4 *)((long)&(node->_reader).segment + 4);
        local_58.capTable._0_4_ = *(undefined4 *)&(node->_reader).capTable;
        local_58.capTable._4_4_ = *(undefined4 *)((long)&(node->_reader).capTable + 4);
      }
      local_58.nestingLimit = iVar7;
      capnp::_::PointerReader::getList((ListReader *)&f,&local_58,INLINE_COMPOSITE,(word *)0x0);
      if ((uint)uVar3 < uVar6) {
        replacementIsOlder(this);
      }
    }
    uVar6 = (node->_reader).dataSize;
    if (0x6f < uVar6) {
      pvVar2 = (node->_reader).data;
      sVar1 = *(short *)((long)pvVar2 + 0xc);
      if (sVar1 == 3) {
        _kjCondition._0_8_ = (node->_reader).segment;
        _kjCondition.op.content.ptr = (char *)(node->_reader).capTable;
        _kjCondition.op.content.size_ = (size_t)(node->_reader).data;
        _kjCondition._24_8_ = (node->_reader).pointers;
        f.exception = (Exception *)(replacement->_reader).segment;
        checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f);
      }
      else if (sVar1 == 2) {
        _kjCondition._0_8_ = (node->_reader).segment;
        _kjCondition.op.content.ptr = (char *)(node->_reader).capTable;
        _kjCondition.op.content.size_ = (size_t)(node->_reader).data;
        _kjCondition._24_8_ = (node->_reader).pointers;
        f.exception = (Exception *)(replacement->_reader).segment;
        checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f);
      }
      else if (sVar1 == 1) {
        _kjCondition._0_8_ = (node->_reader).segment;
        _kjCondition.op.content.ptr = (char *)(node->_reader).capTable;
        _kjCondition.op.content.size_ = (size_t)(node->_reader).data;
        _kjCondition._24_8_ = (node->_reader).pointers;
        f.exception = (Exception *)(replacement->_reader).segment;
        if (uVar6 < 0xc0) {
          scopeId = 0;
        }
        else {
          scopeId = *(uint64_t *)((long)pvVar2 + 0x10);
        }
        if ((replacement->_reader).dataSize < 0xc0) {
          replacementScopeId = 0;
        }
        else {
          replacementScopeId = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
        }
        checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f,scopeId,replacementScopeId);
      }
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which>&,char_const(&)[28]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x2c1,FAILED,"node.which() == replacement.which()",
               "_kjCondition,\"kind of declaration changed\"",&_kjCondition,
               (char (*) [28])"kind of declaration changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Reader& node,
                          const schema::Node::Reader& replacement) {
    // Returns whether `replacement` is equivalent, older than, newer than, or incompatible with
    // `node`.  If exceptions are enabled, this will throw an exception on INCOMPATIBLE.

    VALIDATE_SCHEMA(node.which() == replacement.which(),
                    "kind of declaration changed");

    // No need to check compatibility of most of the non-body parts of the node:
    // - Arbitrary renaming and moving between scopes is allowed.
    // - Annotations are ignored for compatibility purposes.

    if (replacement.getParameters().size() > node.getParameters().size()) {
      replacementIsNewer();
    } else if (replacement.getParameters().size() < node.getParameters().size()) {
      replacementIsOlder();
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        checkCompatibility(node.getStruct(), replacement.getStruct(),
                           node.getScopeId(), replacement.getScopeId());
        break;
      case schema::Node::ENUM:
        checkCompatibility(node.getEnum(), replacement.getEnum());
        break;
      case schema::Node::INTERFACE:
        checkCompatibility(node.getInterface(), replacement.getInterface());
        break;
      case schema::Node::CONST:
        checkCompatibility(node.getConst(), replacement.getConst());
        break;
      case schema::Node::ANNOTATION:
        checkCompatibility(node.getAnnotation(), replacement.getAnnotation());
        break;
    }
  }